

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O1

size_t __thiscall
booster::locale::impl_icu::icu_std_converter<char,_1>::uconv::cut
          (uconv *this,size_t n,char_type *begin,char_type *end)

{
  bool bVar1;
  UErrorCode err;
  int local_3c;
  char_type *local_38;
  
  local_38 = begin;
  while ((bVar1 = n != 0, n = n - 1, bVar1 && (local_38 < end))) {
    local_3c = 0;
    ucnv_getNextUChar_70(this->cvt_,&local_38,end,&local_3c);
    if (0 < local_3c) {
      return 0;
    }
  }
  return (long)local_38 - (long)begin;
}

Assistant:

size_t cut(size_t n,char_type const *begin,char_type const *end)
            {
                char_type const *saved = begin;
                while(n > 0 && begin < end) {
                    UErrorCode err=U_ZERO_ERROR;
                    ucnv_getNextUChar(cvt_,&begin,end,&err);
                    if(U_FAILURE(err))
                        return 0;
                    n--;
                }
                return begin - saved;
            }